

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr fmt::BasicWriter<wchar_t>::fill_padding
                  (CharPtr buffer,uint total_size,size_t content_size,wchar_t fill)

{
  ulong uVar1;
  wchar_t fill_char;
  wchar_t local_2c;
  
  uVar1 = total_size - content_size >> 1;
  local_2c = fill;
  std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(buffer,uVar1,&local_2c);
  std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
            (buffer + uVar1 + content_size,(total_size - content_size) - uVar1,&local_2c);
  return buffer + uVar1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::fill_padding(
    CharPtr buffer, unsigned total_size,
    std::size_t content_size, wchar_t fill) {
  std::size_t padding = total_size - content_size;
  std::size_t left_padding = padding / 2;
  Char fill_char = internal::CharTraits<Char>::cast(fill);
  std::uninitialized_fill_n(buffer, left_padding, fill_char);
  buffer += left_padding;
  CharPtr content = buffer;
  std::uninitialized_fill_n(buffer + content_size,
                            padding - left_padding, fill_char);
  return content;
}